

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O2

void __thiscall double_conversion::Bignum::ShiftLeft(Bignum *this,int shift_amount)

{
  if (this->used_bigits_ != 0) {
    this->exponent_ = this->exponent_ + (short)(shift_amount / 0x1c);
    EnsureCapacity(this->used_bigits_ + 1);
    BigitsShiftLeft(this,shift_amount % 0x1c);
    return;
  }
  return;
}

Assistant:

void Bignum::ShiftLeft(const int shift_amount) {
  if (used_bigits_ == 0) {
    return;
  }
  exponent_ += (shift_amount / kBigitSize);
  const int local_shift = shift_amount % kBigitSize;
  EnsureCapacity(used_bigits_ + 1);
  BigitsShiftLeft(local_shift);
}